

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

char * getErrorString(int code)

{
  char *pcStack_10;
  int code_local;
  
  switch(code) {
  case 0x10001:
    pcStack_10 = "The GLFW library is not initialized";
    break;
  case 0x10002:
    pcStack_10 = "There is no current context";
    break;
  case 0x10003:
    pcStack_10 = "Invalid argument for enum parameter";
    break;
  case 0x10004:
    pcStack_10 = "Invalid value for parameter";
    break;
  case 0x10005:
    pcStack_10 = "Out of memory";
    break;
  case 0x10006:
    pcStack_10 = "The requested API is unavailable";
    break;
  case 0x10007:
    pcStack_10 = "The requested API version is unavailable";
    break;
  case 0x10008:
    pcStack_10 = "An undocumented platform-specific error occurred";
    break;
  case 0x10009:
    pcStack_10 = "The requested format is unavailable";
    break;
  case 0x1000a:
    pcStack_10 = "The specified window has no context";
    break;
  default:
    pcStack_10 = "ERROR: UNKNOWN GLFW ERROR";
  }
  return pcStack_10;
}

Assistant:

static const char* getErrorString(int code)
{
    switch (code)
    {
        case GLFW_NOT_INITIALIZED:
            return "The GLFW library is not initialized";
        case GLFW_NO_CURRENT_CONTEXT:
            return "There is no current context";
        case GLFW_INVALID_ENUM:
            return "Invalid argument for enum parameter";
        case GLFW_INVALID_VALUE:
            return "Invalid value for parameter";
        case GLFW_OUT_OF_MEMORY:
            return "Out of memory";
        case GLFW_API_UNAVAILABLE:
            return "The requested API is unavailable";
        case GLFW_VERSION_UNAVAILABLE:
            return "The requested API version is unavailable";
        case GLFW_PLATFORM_ERROR:
            return "An undocumented platform-specific error occurred";
        case GLFW_FORMAT_UNAVAILABLE:
            return "The requested format is unavailable";
        case GLFW_NO_WINDOW_CONTEXT:
            return "The specified window has no context";
        default:
            return "ERROR: UNKNOWN GLFW ERROR";
    }
}